

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::PopStyleVar(int count)

{
  ImVector<ImGuiStyleMod> *this;
  ImPlotContext *pIVar1;
  ImGuiStyleMod *pIVar2;
  ImPlotStyleVarInfo *pIVar3;
  ulong uVar4;
  
  pIVar1 = GImPlot;
  if (count <= (GImPlot->StyleModifiers).Size) {
    this = &GImPlot->StyleModifiers;
    for (; 0 < count; count = count + -1) {
      pIVar2 = ImVector<ImGuiStyleMod>::back(this);
      pIVar3 = GetPlotStyleVarInfo(pIVar2->VarIdx);
      uVar4 = (ulong)pIVar3->Offset;
      if (pIVar3->Type == 4) {
        if (pIVar3->Count == 1) {
          *(int *)(pIVar1->RenderY + uVar4 + 6) = (pIVar2->field_1).BackupInt[0];
        }
      }
      else if (pIVar3->Type == 8) {
        if (pIVar3->Count == 2) {
          *(int *)(pIVar1->RenderY + uVar4 + 6) = (pIVar2->field_1).BackupInt[0];
          *(int *)(pIVar1->RenderY + uVar4 + 10) = (pIVar2->field_1).BackupInt[1];
        }
        else if (pIVar3->Count == 1) {
          *(int *)(pIVar1->RenderY + uVar4 + 6) = (pIVar2->field_1).BackupInt[0];
        }
      }
      ImVector<ImGuiStyleMod>::pop_back(this);
    }
    return;
  }
  __assert_fail("(count <= gp.StyleModifiers.Size) && \"You can\'t pop more modifiers than have been pushed!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xcdd,"void ImPlot::PopStyleVar(int)");
}

Assistant:

void PopStyleVar(int count) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(count <= gp.StyleModifiers.Size, "You can't pop more modifiers than have been pushed!");
    while (count > 0) {
        ImGuiStyleMod& backup = gp.StyleModifiers.back();
        const ImPlotStyleVarInfo* info = GetPlotStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&gp.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1) {
            ((float*)data)[0] = backup.BackupFloat[0];
        }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) {
             ((float*)data)[0] = backup.BackupFloat[0];
             ((float*)data)[1] = backup.BackupFloat[1];
        }
        else if (info->Type == ImGuiDataType_S32 && info->Count == 1) {
            ((int*)data)[0] = backup.BackupInt[0];
        }
        gp.StyleModifiers.pop_back();
        count--;
    }
}